

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# day02a.cpp
# Opt level: O2

int day2a::get_bathroom_code(string *input)

{
  char cVar1;
  istream *piVar2;
  _Alloc_hider _Var3;
  uint uVar4;
  int value;
  int iVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  string line;
  istringstream stream;
  
  std::__cxx11::istringstream::istringstream((istringstream *)&stream,(string *)input,_S_in);
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  iVar9 = 1;
  value = 0;
  uVar6 = 1;
  uVar8 = 1;
  while (piVar2 = std::operator>>((istream *)&stream,(string *)&line), _Var3 = line._M_dataplus,
        ((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) == 0) {
    while( true ) {
      cVar1 = *_Var3._M_p;
      iVar7 = (int)uVar8;
      iVar5 = (int)uVar6;
      if (cVar1 == '\0') break;
      _Var3._M_p = _Var3._M_p + 1;
      if (cVar1 == 'D') {
        uVar4 = iVar7 + 1;
        if (1 < iVar7) {
          uVar4 = 2;
        }
        uVar8 = (ulong)uVar4;
      }
      else if (cVar1 == 'L') {
        uVar4 = iVar5 - 1;
        if (iVar5 < 1) {
          uVar4 = 0;
        }
        uVar6 = (ulong)uVar4;
      }
      else if (cVar1 == 'R') {
        uVar4 = iVar5 + 1;
        if (1 < iVar5) {
          uVar4 = 2;
        }
        uVar6 = (ulong)uVar4;
      }
      else if (cVar1 == 'U') {
        uVar4 = iVar7 - 1;
        if (iVar7 < 1) {
          uVar4 = 0;
        }
        uVar8 = (ulong)uVar4;
      }
    }
    value = value + (char)keypad[uVar6 + uVar8 * 3] * iVar9;
    iVar9 = iVar9 * 10;
  }
  iVar9 = reverse(value,10);
  std::__cxx11::string::~string((string *)&line);
  std::__cxx11::istringstream::~istringstream((istringstream *)&stream);
  return iVar9;
}

Assistant:

int get_bathroom_code(const std::string& input) {
		std::istringstream stream(input);
		std::string line;
		Position position{1,1};
		int code = 0;
		int i = 1;
		while(stream >> line) {
			const char* p = line.c_str();
			while(*p) {
				switch(*p++) {
				case 'U': if(position.y > 0) --position.y; break;
				case 'R': if(position.x < 2) ++position.x; break;
				case 'D': if(position.y < 2) ++position.y; break;
				case 'L': if(position.x > 0) --position.x; break;
				}
			}
			code += keypad[position.x + position.y * width] * i;
			i *= 10;
		}
		return reverse(code, 10);
	}